

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon.cxx
# Opt level: O0

void __thiscall Fl_File_Icon::~Fl_File_Icon(Fl_File_Icon *this)

{
  Fl_File_Icon *local_20;
  Fl_File_Icon *prev;
  Fl_File_Icon *current;
  Fl_File_Icon *this_local;
  
  local_20 = (Fl_File_Icon *)0x0;
  for (prev = first_; prev != this && prev != (Fl_File_Icon *)0x0; prev = prev->next_) {
    local_20 = prev;
  }
  if (prev != (Fl_File_Icon *)0x0) {
    if (local_20 == (Fl_File_Icon *)0x0) {
      first_ = prev->next_;
    }
    else {
      local_20->next_ = prev->next_;
    }
  }
  if (this->alloc_data_ != 0) {
    free(this->data_);
  }
  return;
}

Assistant:

Fl_File_Icon::~Fl_File_Icon() {
  Fl_File_Icon	*current,	// Current icon in list
		*prev;		// Previous icon in list


  // Find the icon in the list...
  for (current = first_, prev = (Fl_File_Icon *)0;
       current != this && current != (Fl_File_Icon *)0;
       prev = current, current = current->next_) {/*empty*/}

  // Remove the icon from the list as needed...
  if (current)
  {
    if (prev)
      prev->next_ = current->next_;
    else
      first_ = current->next_;
  }

  // Free any memory used...
  if (alloc_data_)
    free(data_);
}